

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFFT.hpp
# Opt level: O3

void __thiscall audiofft::OouraFFT::cftfsub(OouraFFT *this,int n,double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  ulong uVar6;
  uint l;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  uVar8 = 2;
  if (8 < n) {
    cft1st(this,n,a,w);
    uVar8 = 8;
    if (0x20 < (uint)n) {
      uVar5 = 0x20;
      l = 8;
      do {
        uVar8 = uVar5;
        cftmdl(this,n,l,a,w);
        uVar5 = uVar8 * 4;
        l = uVar8;
      } while ((int)(uVar8 * 4) < n);
    }
  }
  if (uVar8 * 4 == n) {
    if (0 < (int)uVar8) {
      uVar6 = (ulong)uVar8;
      uVar7 = 0;
      do {
        dVar9 = a[uVar7];
        dVar10 = (a + uVar7)[1];
        dVar1 = a[uVar6 + uVar7];
        dVar2 = (a + uVar6 + uVar7)[1];
        dVar11 = dVar9 - dVar1;
        dVar12 = dVar10 - dVar2;
        dVar13 = a[uVar6 * 2 + uVar7];
        dVar14 = (a + uVar6 * 2 + uVar7)[1];
        dVar3 = a[uVar6 * 3 + uVar7];
        dVar4 = (a + uVar6 * 3 + uVar7)[1];
        dVar15 = dVar13 - dVar3;
        dVar16 = dVar14 - dVar4;
        dVar9 = dVar9 + dVar1;
        dVar10 = dVar10 + dVar2;
        dVar13 = dVar13 + dVar3;
        dVar14 = dVar14 + dVar4;
        a[uVar7] = dVar9 + dVar13;
        (a + uVar7)[1] = dVar10 + dVar14;
        a[uVar6 * 2 + uVar7] = dVar9 - dVar13;
        (a + uVar6 * 2 + uVar7)[1] = dVar10 - dVar14;
        a[uVar6 + uVar7] = dVar11 - dVar16;
        (a + uVar6 + uVar7)[1] = dVar15 + dVar12;
        a[uVar6 * 3 + uVar7] = dVar16 + dVar11;
        (a + uVar6 * 3 + uVar7)[1] = dVar12 - dVar15;
        uVar7 = uVar7 + 2;
      } while (uVar7 < uVar6);
    }
  }
  else if (0 < (int)uVar8) {
    uVar6 = (ulong)uVar8;
    uVar7 = 0;
    do {
      dVar9 = a[uVar7];
      dVar10 = (a + uVar7)[1];
      dVar1 = a[uVar6 + uVar7];
      dVar2 = (a + uVar6 + uVar7)[1];
      a[uVar7] = dVar1 + dVar9;
      a[uVar7 + 1] = dVar10 + a[uVar6 + uVar7 + 1];
      a[uVar6 + uVar7] = dVar9 - dVar1;
      (a + uVar6 + uVar7)[1] = dVar10 - dVar2;
      uVar7 = uVar7 + 2;
    } while (uVar7 < uVar6);
  }
  return;
}

Assistant:

void cftfsub(int n, double *a, double *w)
        {
          int j, j1, j2, j3, l;
          double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

          l = 2;
          if (n > 8) {
            cft1st(n, a, w);
            l = 8;
            while ((l << 2) < n) {
              cftmdl(n, l, a, w);
              l <<= 2;
            }
          }
          if ((l << 2) == n) {
            for (j = 0; j < l; j += 2) {
              j1 = j + l;
              j2 = j1 + l;
              j3 = j2 + l;
              x0r = a[j] + a[j1];
              x0i = a[j + 1] + a[j1 + 1];
              x1r = a[j] - a[j1];
              x1i = a[j + 1] - a[j1 + 1];
              x2r = a[j2] + a[j3];
              x2i = a[j2 + 1] + a[j3 + 1];
              x3r = a[j2] - a[j3];
              x3i = a[j2 + 1] - a[j3 + 1];
              a[j] = x0r + x2r;
              a[j + 1] = x0i + x2i;
              a[j2] = x0r - x2r;
              a[j2 + 1] = x0i - x2i;
              a[j1] = x1r - x3i;
              a[j1 + 1] = x1i + x3r;
              a[j3] = x1r + x3i;
              a[j3 + 1] = x1i - x3r;
            }
          } else {
            for (j = 0; j < l; j += 2) {
              j1 = j + l;
              x0r = a[j] - a[j1];
              x0i = a[j + 1] - a[j1 + 1];
              a[j] += a[j1];
              a[j + 1] += a[j1 + 1];
              a[j1] = x0r;
              a[j1 + 1] = x0i;
            }
          }
        }